

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

void __thiscall module::module(module *this,string *basePath,string *module)

{
  long lVar1;
  ulong uVar2;
  string *in_RSI;
  string *in_RDI;
  string *__rhs;
  string *in_stack_00000108;
  string *in_stack_00000488;
  module *in_stack_00000490;
  char *local_c8;
  string *this_00;
  string local_88 [32];
  string local_68 [32];
  string local_48 [72];
  
  this_00 = in_RDI;
  std::__cxx11::string::string(in_RDI);
  std::__cxx11::string::string(this_00 + 0x20);
  std::__cxx11::string::string(this_00 + 0x40);
  __rhs = this_00 + 0x60;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x118fdc);
  std::__cxx11::string::operator=(this_00,in_RSI);
  lVar1 = std::__cxx11::string::find((char *)in_RDI,0x1494cf);
  if (lVar1 == -1) {
    local_c8 = "/";
  }
  else {
    local_c8 = "\\";
  }
  std::__cxx11::string::operator=(in_RDI + 0x20,local_c8);
  std::__cxx11::string::string(local_48,in_RSI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                 (char *)__rhs);
  listFilesRecursively(this,basePath,module);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_48);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    utilities::normalizePath(in_stack_00000108);
    getMetaData(in_stack_00000490,in_stack_00000488);
    std::__cxx11::string::~string(local_88);
  }
  return;
}

Assistant:

module::module(std::string basePath, std::string module)
{
    base_path = basePath;
    sepd = (base_path.find("\\") != std::string::npos) ? "\\" : "/";

#if defined(DEBUG)
    std::cout << "looking for module: " << module << std::endl;
#endif
    listFilesRecursively(basePath, module + ".h");

    if(!module_header.empty())
    {
        getMetaData( utilities::normalizePath(module_header) );
#if defined(DEBUG)
        std::cout << module << " : metaData " << metaData.size() << std::endl;
        std::cout << "dependencies length: " << metaData["dependencies"].length() << std::endl;
#endif
    }
}